

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O0

ParameterDeclarationSymbol * __thiscall
psy::C::SemanticModel::parameterFor(SemanticModel *this,ParameterDeclarationSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  DeclaratorSyntax *node_00;
  Symbol *this_00;
  pointer pSVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  ParameterDeclarationSymbol *parmDecl;
  DeclarationSymbol *decl;
  ParameterDeclarationSyntax *node_local;
  SemanticModel *this_local;
  
  node_00 = ParameterDeclarationSyntax::declarator(node);
  this_00 = &declarationBy(this,node_00)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    pSVar3 = std::
             unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
             ::operator->(&this->impl_);
    if ((pSVar3->bindingIsOK_ & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa5);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"<empty message>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    this_local = (SemanticModel *)0x0;
  }
  else {
    SVar1 = Symbol::kind(this_00);
    if (SVar1 == ParameterDeclaration) {
      iVar2 = (*this_00->_vptr_Symbol[0xe])();
      this_local = (SemanticModel *)CONCAT44(extraout_var,iVar2);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa8);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"<empty message>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local = (SemanticModel *)0x0;
    }
  }
  return (ParameterDeclarationSymbol *)this_local;
}

Assistant:

ParameterDeclarationSymbol* SemanticModel::parameterFor(const ParameterDeclarationSyntax* node)
{
    auto decl = declarationBy(node->declarator());
    if (!decl) {
        PSY_ASSERT_1(!P->bindingIsOK_);
        return nullptr;
    }
    PSY_ASSERT_2(decl->kind() == SymbolKind::ParameterDeclaration, return nullptr);
    auto parmDecl = decl->asParameterDeclaration();
    return parmDecl;
}